

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_bitwise.cpp
# Opt level: O3

spv_result_t
spvtools::val::ValidateBaseType(ValidationState_t *_,Instruction *inst,uint32_t base_type)

{
  bool bVar1;
  uint32_t uVar2;
  DiagnosticStream *pDVar3;
  long lVar4;
  Op opcode;
  char *pcVar5;
  spv_result_t sVar6;
  string local_230;
  char *local_210;
  DiagnosticStream local_208;
  
  opcode = (Op)(inst->inst_).opcode;
  bVar1 = ValidationState_t::IsIntScalarType(_,base_type);
  if ((bVar1) || (bVar1 = ValidationState_t::IsIntVectorType(_,base_type), bVar1)) {
    bVar1 = spvIsVulkanEnv(_->context_->target_env);
    if ((bVar1) &&
       ((uVar2 = ValidationState_t::GetBitWidth(_,base_type), uVar2 != 0x20 &&
        (_->options_->allow_vulkan_32_bit_bitwise == false)))) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_230,_,0x12ad,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Expected 32-bit int type for Base operand: ",0x2b);
      local_210 = spvOpcodeString(opcode);
      pDVar3 = DiagnosticStream::operator<<(&local_208,&local_210);
      sVar6 = pDVar3->error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0062f9b5;
    }
    if (opcode == OpBitCount) {
      return SPV_SUCCESS;
    }
    if ((inst->inst_).type_id == base_type) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar5 = "Expected Base Type to be equal to Result Type: ";
    lVar4 = 0x2f;
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar5 = "Expected int scalar or vector type for Base operand: ";
    lVar4 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar5,lVar4);
  local_230._M_dataplus._M_p = spvOpcodeString(opcode);
  pDVar3 = DiagnosticStream::operator<<(&local_208,(char **)&local_230);
  sVar6 = pDVar3->error_;
LAB_0062f9b5:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return sVar6;
}

Assistant:

spv_result_t ValidateBaseType(ValidationState_t& _, const Instruction* inst,
                              const uint32_t base_type) {
  const spv::Op opcode = inst->opcode();

  if (!_.IsIntScalarType(base_type) && !_.IsIntVectorType(base_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected int scalar or vector type for Base operand: "
           << spvOpcodeString(opcode);
  }

  // Vulkan has a restriction to 32 bit for base
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (_.GetBitWidth(base_type) != 32 &&
        !_.options()->allow_vulkan_32_bit_bitwise) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4781)
             << "Expected 32-bit int type for Base operand: "
             << spvOpcodeString(opcode);
    }
  }

  // OpBitCount just needs same number of components
  if (base_type != inst->type_id() && opcode != spv::Op::OpBitCount) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Base Type to be equal to Result Type: "
           << spvOpcodeString(opcode);
  }

  return SPV_SUCCESS;
}